

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpRepeatedString<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  SerialArena *this;
  __int_type_conflict _Var3;
  __pointer_type pSVar4;
  bool bVar5;
  uint uVar6;
  Rep *pRVar7;
  ushort *p;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar8;
  string *s;
  ushort *ptr_00;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar9;
  Nonnull<const_char_*> failure_msg;
  uint uVar10;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_00;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *this_00;
  unsigned_long v2;
  ulong uVar11;
  uint *puVar12;
  uint64_t uVar13;
  uint uVar14;
  long in_FS_OFFSET;
  string_view wire_bytes;
  string_view str;
  string_view wire_bytes_00;
  pair<const_char_*,_int> pVar15;
  pair<const_char_*,_unsigned_int> pVar16;
  LogMessage local_40;
  
  table_00.data = (long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20);
  if ((table_00.data & 3) != 0) {
    AlignFail(table_00.data);
  }
  uVar6 = data.field_0._0_4_;
  if ((uVar6 & 7) != 2) {
    UNRECOVERED_JUMPTABLE = table->fallback;
    goto LAB_0021ea99;
  }
  uVar14 = *(ushort *)(table_00.data + 10) & 0x1c0;
  if (uVar14 != 0x100) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x9b7);
    str._M_str = "Unsupported repeated string rep: ";
    str._M_len = 0x21;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_40,str);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&local_40,(unsigned_short)uVar14);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  this_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
            ((long)&msg->_vptr_MessageLite + (ulong)*(uint *)table_00);
  if (((ulong)this_00 & 7) != 0) {
    AlignFail(this_00);
  }
  uVar14 = *(ushort *)(table_00.data + 10) & 0x600;
  uVar13 = hasbits;
  ptr_00 = (ushort *)ptr;
  if (((long *)this_00[2].data == (long *)0x0) ||
     (data.field_0.data = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0xffffffffffffff80,
     *(long *)(in_FS_OFFSET + -0x78) != *(long *)this_00[2].data)) {
LAB_0021e9ca:
    do {
      s = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this_00);
      ptr = InlineGreedyStringParser(s,(char *)ptr_00,ctx);
      ctx_00 = extraout_RDX_01;
      if ((ushort *)ptr == (ushort *)0x0) goto LAB_0021eadd;
      ptr_00 = (ushort *)(s->_M_dataplus)._M_p;
      wire_bytes_00._M_str = (char *)table;
      wire_bytes_00._M_len = (size_t)ptr_00;
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (anon_union_8_1_898a9ca8_for_TcFieldData_0)table_00.data;
      bVar5 = MpVerifyUtf8((TcParser *)s->_M_string_length,wire_bytes_00,
                           (TcParseTableBase *)table_00,(FieldEntry *)(ulong)uVar14,(uint16_t)uVar13
                          );
      ctx_00 = extraout_RDX_02;
      if (!bVar5) goto LAB_0021eadd;
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) goto LAB_0021eaa9;
      bVar1 = (byte)*(ushort *)ptr;
      uVar10 = (uint)bVar1;
      ptr_00 = (ushort *)((long)ptr + 1);
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)ptr_00;
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((ulong)bVar2 << 7);
        uVar10 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        if ((char)bVar2 < '\0') {
          pVar16 = ReadTagFallback(ptr,uVar10);
          uVar10 = pVar16.second;
          ptr_00 = (ushort *)pVar16.first;
        }
        else {
          ptr_00 = (ushort *)((long)ptr + 2);
        }
      }
      p = (ushort *)ptr;
    } while (uVar10 == uVar6);
  }
  else {
    this = *(SerialArena **)(in_FS_OFFSET + -0x70);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)this_00->data;
    if (((ulong)data.field_0 & 1) == 0) {
      uVar10 = (uint)(data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0);
    }
    else {
      pRVar7 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this_00);
      uVar10 = pRVar7->allocated_size;
    }
    if (uVar10 != *(uint *)(this_00 + 1)) goto LAB_0021e9ca;
    do {
      bVar1 = (byte)*(ushort *)ptr;
      ptr_00 = (ushort *)(ulong)bVar1;
      uVar10 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        pVar15 = ReadSizeFallback(ptr,(uint)bVar1);
        ctx_00 = pVar15._8_8_;
        if ((ushort *)pVar15.first == (ushort *)0x0) {
LAB_0021eadd:
          pcVar9 = Error(msg,(char *)ptr_00,ctx_00,data,table,hasbits);
          return pcVar9;
        }
        uVar10 = pVar15.second;
        ptr_00 = (ushort *)pVar15.first;
      }
      else {
        ptr_00 = (ushort *)((long)ptr + 1);
      }
      _Var3 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
      if (_Var3 == 0) {
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       SerialArena::AllocateFromStringBlockFallback(this);
      }
      else {
        uVar11 = _Var3 - 0x20;
        (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = uVar11;
        pSVar4 = (this->string_block_)._M_b._M_p;
        v2 = (ulong)pSVar4->allocated_size_ - 0x10;
        if (v2 < uVar11) {
          failure_msg = absl::lts_20250127::log_internal::
                        MakeCheckOpString<unsigned_long,unsigned_long>
                                  (uVar11,v2,"offset <= effective_size()");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/string_block.h"
                     ,0xa2,failure_msg);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_40);
        }
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((long)&pSVar4[-1].next_ + _Var3);
      }
      *(uint64_t *)data.field_0 = (long)data.field_0 + 0x10;
      *(undefined8 *)((long)data.field_0 + 8) = 0;
      *(undefined1 *)((long)data.field_0 + 0x10) = 0;
      RepeatedPtrFieldBase::AddAllocatedForParse
                ((RepeatedPtrFieldBase *)this_00,(void *)data.field_0);
      p = (ushort *)
          EpsCopyInputStream::ReadString
                    (&ctx->super_EpsCopyInputStream,(char *)ptr_00,uVar10,(string *)data.field_0);
      ctx_00 = extraout_RDX;
      if (p == (ushort *)0x0) goto LAB_0021eadd;
      pVVar8 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
      ptr_00 = (ushort *)(pVVar8->_M_dataplus)._M_p;
      wire_bytes._M_str = (char *)table;
      wire_bytes._M_len = (size_t)ptr_00;
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (anon_union_8_1_898a9ca8_for_TcFieldData_0)table_00.data;
      bVar5 = MpVerifyUtf8((TcParser *)pVVar8->_M_string_length,wire_bytes,
                           (TcParseTableBase *)table_00,(FieldEntry *)(ulong)uVar14,(uint16_t)uVar13
                          );
      ctx_00 = extraout_RDX_00;
      if (!bVar5) goto LAB_0021eadd;
      ptr = (char *)p;
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) goto LAB_0021eaa9;
      bVar1 = (byte)*p;
      uVar10 = (uint)bVar1;
      ptr = (char *)((long)p + 1);
      if ((char)bVar1 < '\0') {
        bVar2 = *ptr;
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)((ulong)bVar2 << 7);
        uVar10 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        if ((char)bVar2 < '\0') {
          pVar16 = ReadTagFallback((char *)p,uVar10);
          uVar10 = pVar16.second;
          ptr = pVar16.first;
        }
        else {
          ptr = (char *)(p + 1);
        }
      }
    } while (uVar10 == uVar6);
  }
  ptr = (char *)p;
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
LAB_0021eaa9:
    if ((ulong)table->has_bits_offset != 0) {
      puVar12 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar12 & 3) != 0) {
        AlignFail();
      }
      *puVar12 = *puVar12 | (uint)hasbits;
    }
    return (char *)(ushort *)ptr;
  }
  uVar6 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
  if ((uVar6 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  uVar11 = (ulong)(uVar6 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar11 * 2));
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar11);
LAB_0021ea99:
  pcVar9 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
  return pcVar9;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedString(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
  }

  const uint16_t rep = type_card & field_layout::kRepMask;
  const uint16_t xform_val = type_card & field_layout::kTvMask;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  switch (rep) {
    case field_layout::kRepSString: {
      auto& field = MaybeCreateRepeatedPtrFieldRefAt<std::string, is_split>(
          base, entry.offset, msg);
      const char* ptr2 = ptr;
      uint32_t next_tag;

      auto* arena = field.GetArena();
      SerialArena* serial_arena;
      if (ABSL_PREDICT_TRUE(arena != nullptr &&
                            arena->impl_.GetSerialArenaFast(&serial_arena) &&
                            field.PrepareForParse())) {
        do {
          ptr = ptr2;
          ptr = ParseRepeatedStringOnce(ptr, serial_arena, ctx, field);
          if (ABSL_PREDICT_FALSE(ptr == nullptr ||
                                 !MpVerifyUtf8(field[field.size() - 1], table,
                                               entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      } else {
        do {
          ptr = ptr2;
          std::string* str = field.Add();
          ptr = InlineGreedyStringParser(str, ptr, ctx);
          if (ABSL_PREDICT_FALSE(
                  ptr == nullptr ||
                  !MpVerifyUtf8(*str, table, entry, xform_val))) {
            PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
          }
          if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
          ptr2 = ReadTag(ptr, &next_tag);
        } while (next_tag == decoded_tag);
      }

      break;
    }

#ifndef NDEBUG
    default:
      ABSL_LOG(FATAL) << "Unsupported repeated string rep: " << rep;
      break;
#endif
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}